

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderAtomicAndCase::verify
          (ShaderAtomicAndCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *poVar1;
  Precision PVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  Hex<8UL> hex;
  uint uVar13;
  int iVar14;
  Hex<8UL> hex_00;
  Hex<8UL> hex_01;
  int iVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  bool bVar19;
  int in_stack_00000008;
  long in_stack_00000010;
  MessageBuilder local_1b0;
  
  uVar13 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1] *
           (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2] *
           (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0];
  uVar5 = (long)((ulong)(uint)((int)ctx >> 0x1f) << 0x20 | (ulong)ctx & 0xffffffff) /
          (long)(int)uVar13;
  PVar2 = (this->super_ShaderAtomicOpCase).m_precision;
  uVar18 = 0xff;
  if (PVar2 == PRECISION_MEDIUMP) {
    uVar18 = 0xffff;
  }
  if ((this->super_ShaderAtomicOpCase).m_type == TYPE_UINT) {
    uVar18 = 0xffffffff;
  }
  if (PVar2 == PRECISION_HIGHP) {
    uVar18 = 0xffffffff;
  }
  uVar3 = (this->super_ShaderAtomicOpCase).m_initialValue;
  iVar14 = 0;
  uVar12 = 0;
  if (0 < (int)uVar13) {
    uVar12 = (ulong)uVar13;
  }
  uVar7 = 0;
  if (0 < (int)uVar5) {
    uVar7 = uVar5 & 0xffffffff;
  }
  iVar6 = 0;
  uVar10 = 0;
  do {
    if (uVar10 == uVar7) {
LAB_00451179:
      return (int)CONCAT71((int7)(int3)(uVar5 >> 8),(long)(int)uVar5 <= (long)uVar10);
    }
    iVar8 = (int)uVar10;
    uVar4 = *(uint *)(in_stack_00000010 + iVar8 * in_stack_00000008);
    hex_00.value._4_4_ = 0;
    hex_00.value._0_4_ = uVar4;
    uVar16 = uVar12;
    uVar11 = uVar3;
    iVar9 = iVar6;
    while (bVar19 = uVar16 != 0, uVar16 = uVar16 - 1, bVar19) {
      uVar11 = uVar11 & *(uint *)(siglen + (long)iVar9);
      iVar9 = iVar9 + (int)sig;
    }
    if (((uVar11 ^ uVar4) & uVar18) != 0) {
      local_1b0.m_log =
           ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
      poVar1 = &local_1b0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"ERROR: at group ");
      std::ostream::operator<<(poVar1,iVar8);
      std::operator<<((ostream *)poVar1,": expected ");
      hex.value._4_4_ = 0;
      hex.value._0_4_ = uVar11;
      tcu::Format::operator<<((ostream *)poVar1,hex);
      std::operator<<((ostream *)poVar1,", got ");
      tcu::Format::operator<<((ostream *)poVar1,hex_00);
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00451171:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
      goto LAB_00451179;
    }
    iVar9 = -1;
    uVar16 = uVar12;
    iVar15 = iVar14;
    while (bVar19 = uVar16 != 0, uVar16 = uVar16 - 1, bVar19) {
      lVar17 = (long)iVar15;
      hex_01.value._4_4_ = 0;
      hex_01.value._0_4_ = *(uint *)(tbslen + lVar17);
      iVar9 = iVar9 + 1;
      iVar15 = iVar15 + (int)tbs;
      if (((uVar3 ^ 0xffffffff) & uVar18 & *(uint *)(tbslen + lVar17)) != 0) {
        local_1b0.m_log =
             ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = &local_1b0.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"ERROR: at group ");
        std::ostream::operator<<(poVar1,iVar8);
        std::operator<<((ostream *)poVar1,", invocation ");
        std::ostream::operator<<(poVar1,iVar9);
        std::operator<<((ostream *)poVar1,": found unexpected value ");
        tcu::Format::operator<<((ostream *)poVar1,hex_01);
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00451171;
      }
    }
    uVar10 = uVar10 + 1;
    iVar6 = iVar6 + uVar13 * (int)sig;
    iVar14 = iVar14 + uVar13 * (int)tbs;
  } while( true );
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;
		const int		numBits			= m_precision == PRECISION_HIGHP ? 32 :
										  m_precision == PRECISION_MEDIUMP ? 16 : 8;
		const deUint32	compareMask		= (m_type == TYPE_UINT || numBits == 32) ? ~0u : (1u<<numBits)-1u;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int		groupOffset		= groupNdx*workGroupSize;
			const deUint32	groupOutput		= *(const deUint32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			deUint32		expectedValue	= m_initialValue;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 inputValue = *(const deUint32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				expectedValue &= inputValue;
			}

			if ((groupOutput & compareMask) != (expectedValue & compareMask))
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": expected " << tcu::toHex(expectedValue) << ", got " << tcu::toHex(groupOutput) << TestLog::EndMessage;
				return false;
			}

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 outputValue = *(const deUint32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if ((compareMask & (outputValue & ~m_initialValue)) != 0)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found unexpected value " << tcu::toHex(outputValue)
									   << TestLog::EndMessage;
					return false;
				}
			}
		}

		return true;
	}